

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkBitwiseParenBool(CheckerVisitor *this,BinExpr *expr)

{
  TreeOp TVar1;
  Node *this_00;
  Node *this_01;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *r;
  Expr *l;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = &BinExpr::lhs(in_RSI)->super_Node;
    this_01 = &BinExpr::rhs(in_RSI)->super_Node;
    TVar1 = Node::op((Node *)in_RSI);
    if (((TVar1 == TO_OROR) || (TVar1 = Node::op((Node *)in_RSI), TVar1 == TO_ANDAND)) &&
       ((TVar1 = Node::op(this_00), TVar1 == TO_AND ||
        (((TVar1 = Node::op(this_00), TVar1 == TO_OR || (TVar1 = Node::op(this_01), TVar1 == TO_AND)
          ) || (TVar1 = Node::op(this_01), TVar1 == TO_OR)))))) {
      report(in_RDI,(Node *)in_RSI,0x3b);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkBitwiseParenBool(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_OROR || expr->op() == TO_ANDAND) {
    if (l->op() == TO_AND || l->op() == TO_OR || r->op() == TO_AND || r->op() == TO_OR) {
      report(expr, DiagnosticsId::DI_BITWISE_BOOL_PAREN);
    }
  }
}